

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void __thiscall diy::Bounds<float>::Bounds(Bounds<float> *this,int dim)

{
  Coordinate_conflict unaff_retaddr;
  size_t in_stack_00000008;
  DynamicPoint<float,_4UL> *in_stack_00000010;
  
  DynamicPoint<float,_4UL>::DynamicPoint(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  DynamicPoint<float,_4UL>::DynamicPoint(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}